

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall
kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>::Maybe
          (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *this,
          Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *other)

{
  uchar *puVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  byte bVar4;
  
  bVar4 = (other->ptr).isSet;
  (this->ptr).isSet = (bool)bVar4;
  if ((bool)bVar4 == true) {
    (this->ptr).field_1.value.buffer.ptr = (other->ptr).field_1.value.buffer.ptr;
    (this->ptr).field_1.value.buffer.size_ = (other->ptr).field_1.value.buffer.size_;
    (this->ptr).field_1.value.buffer.disposer = (other->ptr).field_1.value.buffer.disposer;
    (other->ptr).field_1.value.buffer.ptr = (uchar *)0x0;
    (other->ptr).field_1.value.buffer.size_ = 0;
    sVar2 = (other->ptr).field_1.value.leftover.size_;
    (this->ptr).field_1.value.leftover.ptr = (other->ptr).field_1.value.leftover.ptr;
    (this->ptr).field_1.value.leftover.size_ = sVar2;
    bVar4 = (other->ptr).isSet;
  }
  if ((bVar4 & 1) != 0) {
    (other->ptr).isSet = false;
    puVar1 = (other->ptr).field_1.value.buffer.ptr;
    if (puVar1 != (uchar *)0x0) {
      sVar2 = (other->ptr).field_1.value.buffer.size_;
      (other->ptr).field_1.value.buffer.ptr = (uchar *)0x0;
      (other->ptr).field_1.value.buffer.size_ = 0;
      pAVar3 = (other->ptr).field_1.value.buffer.disposer;
      (**pAVar3->_vptr_ArrayDisposer)(pAVar3,puVar1,1,sVar2,sVar2,0);
    }
  }
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }